

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

lua_CFunction lua_tocfunction(lua_State *L,int idx)

{
  uint uVar1;
  TValue *pTVar2;
  int in_ESI;
  lua_State *in_RDI;
  BCOp op;
  cTValue *o;
  lua_CFunction local_8;
  
  pTVar2 = index2adr(in_RDI,in_ESI);
  if (((pTVar2->field_2).it == 0xfffffff7) &&
     ((uVar1 = *(uint *)(ulong)*(uint *)((ulong)(pTVar2->u32).lo + 0x10) & 0xff, uVar1 == 0x5f ||
      (uVar1 == 0x60)))) {
    local_8 = *(lua_CFunction *)((ulong)(pTVar2->u32).lo + 0x18);
  }
  else {
    local_8 = (lua_CFunction)0x0;
  }
  return local_8;
}

Assistant:

LUA_API lua_CFunction lua_tocfunction(lua_State *L, int idx)
{
  cTValue *o = index2adr(L, idx);
  if (tvisfunc(o)) {
    BCOp op = bc_op(*mref(funcV(o)->c.pc, BCIns));
    if (op == BC_FUNCC || op == BC_FUNCCW)
      return funcV(o)->c.f;
  }
  return NULL;
}